

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O0

void Ivy_ManHaigStart(Ivy_Man_t *p,int fVerbose)

{
  int iVar1;
  Ivy_Man_t *pIVar2;
  Vec_Int_t *p_00;
  Ivy_Obj_t *pObj_00;
  int local_2c;
  int i;
  Ivy_Obj_t *pObj;
  Vec_Int_t *vLatches;
  int fVerbose_local;
  Ivy_Man_t *p_local;
  
  if (p->pHaig == (Ivy_Man_t *)0x0) {
    pIVar2 = Ivy_ManDup(p);
    p->pHaig = pIVar2;
    if (fVerbose != 0) {
      printf("Starting : ");
      Ivy_ManPrintStats(p->pHaig);
    }
    p_00 = Vec_IntAlloc(100);
    for (local_2c = 0; iVar1 = Vec_PtrSize(p->pHaig->vObjs), local_2c < iVar1;
        local_2c = local_2c + 1) {
      pObj_00 = (Ivy_Obj_t *)Vec_PtrEntry(p->pHaig->vObjs,local_2c);
      if ((pObj_00 != (Ivy_Obj_t *)0x0) && (iVar1 = Ivy_ObjIsLatch(pObj_00), iVar1 != 0)) {
        *(uint *)&pObj_00->field_0x8 = *(uint *)&pObj_00->field_0x8 & 0xfffff9ff | 0x600;
        Vec_IntPush(p_00,pObj_00->Id);
      }
    }
    p->pHaig->pData = p_00;
    return;
  }
  __assert_fail("p->pHaig == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyHaig.c"
                ,99,"void Ivy_ManHaigStart(Ivy_Man_t *, int)");
}

Assistant:

void Ivy_ManHaigStart( Ivy_Man_t * p, int fVerbose )
{
    Vec_Int_t * vLatches;
    Ivy_Obj_t * pObj;
    int i;
    assert( p->pHaig == NULL );
    p->pHaig = Ivy_ManDup( p );

    if ( fVerbose )
    {
        printf( "Starting : " );
        Ivy_ManPrintStats( p->pHaig );
    }

    // collect latches of design D and set their values to be DC
    vLatches = Vec_IntAlloc( 100 );
    Ivy_ManForEachLatch( p->pHaig, pObj, i )
    {
        pObj->Init = IVY_INIT_DC;
        Vec_IntPush( vLatches, pObj->Id );
    }
    p->pHaig->pData = vLatches;
/*
    {
        int x;
        Ivy_ManShow( p, 0, NULL );
        Ivy_ManShow( p->pHaig, 1, NULL );
        x = 0;
    }
*/
}